

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

void Assimp::ExportScene3DS
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DeadlyImportError *this;
  pointer paVar3;
  undefined1 local_180 [8];
  Discreet3DSExporter exporter;
  SplitLargeMeshesProcess_Vertex vert_splitter;
  SplitLargeMeshesProcess_Triangle tri_splitter;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> scenecopy;
  aiScene *scenecopy_tmp;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  shared_ptr<Assimp::IOStream> outfile;
  ExportProperties *param_3_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  outfile.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_4;
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wb");
  std::shared_ptr<Assimp::IOStream>::shared_ptr<Assimp::IOStream,void>
            ((shared_ptr<Assimp::IOStream> *)local_38,(IOStream *)CONCAT44(extraout_var,iVar2));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (!bVar1) {
    this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pFile,&local_79);
    std::operator+(&local_58,"Could not open output .3ds file: ",&local_78);
    DeadlyImportError::DeadlyImportError(this,&local_58);
    __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  SceneCombiner::CopyScene((aiScene **)&scenecopy,pScene,true);
  std::unique_ptr<aiScene,std::default_delete<aiScene>>::
  unique_ptr<std::default_delete<aiScene>,void>
            ((unique_ptr<aiScene,std::default_delete<aiScene>> *)&tri_splitter.LIMIT,
             (pointer)scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>.
                      _M_t.super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
                      super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
  SplitLargeMeshesProcess_Triangle::SplitLargeMeshesProcess_Triangle
            ((SplitLargeMeshesProcess_Triangle *)&vert_splitter.LIMIT);
  SplitLargeMeshesProcess_Triangle::SetLimit
            ((SplitLargeMeshesProcess_Triangle *)&vert_splitter.LIMIT,0xffff);
  paVar3 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                     ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&tri_splitter.LIMIT);
  SplitLargeMeshesProcess_Triangle::Execute
            ((SplitLargeMeshesProcess_Triangle *)&vert_splitter.LIMIT,paVar3);
  SplitLargeMeshesProcess_Vertex::SplitLargeMeshesProcess_Vertex
            ((SplitLargeMeshesProcess_Vertex *)
             &exporter.meshes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  SplitLargeMeshesProcess_Vertex::SetLimit
            ((SplitLargeMeshesProcess_Vertex *)
             &exporter.meshes._M_t._M_impl.super__Rb_tree_header._M_node_count,0xffff);
  paVar3 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                     ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&tri_splitter.LIMIT);
  SplitLargeMeshesProcess_Vertex::Execute
            ((SplitLargeMeshesProcess_Vertex *)
             &exporter.meshes._M_t._M_impl.super__Rb_tree_header._M_node_count,paVar3);
  paVar3 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get
                     ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&tri_splitter.LIMIT);
  Discreet3DSExporter::Discreet3DSExporter
            ((Discreet3DSExporter *)local_180,(shared_ptr<Assimp::IOStream> *)local_38,paVar3);
  Discreet3DSExporter::~Discreet3DSExporter((Discreet3DSExporter *)local_180);
  SplitLargeMeshesProcess_Vertex::~SplitLargeMeshesProcess_Vertex
            ((SplitLargeMeshesProcess_Vertex *)
             &exporter.meshes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  SplitLargeMeshesProcess_Triangle::~SplitLargeMeshesProcess_Triangle
            ((SplitLargeMeshesProcess_Triangle *)&vert_splitter.LIMIT);
  std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr
            ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&tri_splitter.LIMIT);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)local_38);
  return;
}

Assistant:

void ExportScene3DS(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
{
    std::shared_ptr<IOStream> outfile (pIOSystem->Open(pFile, "wb"));
    if(!outfile) {
        throw DeadlyExportError("Could not open output .3ds file: " + std::string(pFile));
    }

    // TODO: This extra copy should be avoided and all of this made a preprocess
    // requirement of the 3DS exporter.
    //
    // 3DS meshes can be max 0xffff (16 Bit) vertices and faces, respectively.
    // SplitLargeMeshes can do this, but it requires the correct limit to be set
    // which is not possible with the current way of specifying preprocess steps
    // in |Exporter::ExportFormatEntry|.
    aiScene* scenecopy_tmp;
    SceneCombiner::CopyScene(&scenecopy_tmp,pScene);
    std::unique_ptr<aiScene> scenecopy(scenecopy_tmp);

    SplitLargeMeshesProcess_Triangle tri_splitter;
    tri_splitter.SetLimit(0xffff);
    tri_splitter.Execute(scenecopy.get());

    SplitLargeMeshesProcess_Vertex vert_splitter;
    vert_splitter.SetLimit(0xffff);
    vert_splitter.Execute(scenecopy.get());

    // Invoke the actual exporter
    Discreet3DSExporter exporter(outfile, scenecopy.get());
}